

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

void __thiscall helics::SmallBuffer::SmallBuffer(SmallBuffer *this,SmallBuffer *sb)

{
  pointer pvVar1;
  long in_RSI;
  undefined1 *in_RDI;
  
  memset(in_RDI,0,0x40);
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0x40;
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  if ((*(byte *)(in_RSI + 0x5a) & 1) == 0) {
    pvVar1 = CLI::std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x1ca78a);
    memcpy(pvVar1,*(void **)(in_RSI + 0x50),*(size_t *)(in_RSI + 0x40));
    pvVar1 = CLI::std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x1ca7ad);
    *(pointer *)(in_RDI + 0x50) = pvVar1;
  }
  else {
    *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RSI + 0x50);
    *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(in_RSI + 0x48);
    in_RDI[0x5a] = *(byte *)(in_RSI + 0x5a) & 1;
    in_RDI[0x58] = *(byte *)(in_RSI + 0x58) & 1;
    *(undefined1 *)(in_RSI + 0x5a) = 0;
  }
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  pvVar1 = CLI::std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x1ca7d3);
  *(pointer *)(in_RSI + 0x50) = pvVar1;
  *(undefined8 *)(in_RSI + 0x48) = 0x40;
  *(undefined8 *)(in_RSI + 0x40) = 0;
  return;
}

Assistant:

SmallBuffer(SmallBuffer&& sb) noexcept
    {
        if (sb.usingAllocatedBuffer) {
            heap = sb.heap;
            bufferCapacity = sb.bufferCapacity;
            usingAllocatedBuffer = sb.usingAllocatedBuffer;
            nonOwning = sb.nonOwning;
            sb.usingAllocatedBuffer = false;
        } else {
            std::memcpy(buffer.data(), sb.heap, sb.bufferSize);
            heap = buffer.data();
        }
        bufferSize = sb.bufferSize;
        sb.heap = sb.buffer.data();
        sb.bufferCapacity = 64;
        sb.bufferSize = 0;
    }